

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_false,_5>_> __thiscall
immutable::rrb_pop<int,false,5>(immutable *this,ref<immutable::rrb<int,_false,_5>_> *in)

{
  int *piVar1;
  size_t __size;
  uint32_t uVar2;
  rrb<int,_false,_5> *prVar3;
  leaf_node<int,_false> *plVar4;
  tree_node<int,_false> *ptVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  int *piVar10;
  leaf_node<int,_false> *__s;
  ulong uVar11;
  uint uVar12;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_40;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *local_38;
  
  prVar3 = in->ptr;
  if (prVar3 != (rrb<int,_false,_5> *)0x0) {
    if (prVar3->cnt == 1) {
      puVar9 = (undefined8 *)malloc(0x28);
      *puVar9 = 0;
      *(undefined4 *)(puVar9 + 1) = 0;
      puVar9[2] = 0;
      puVar9[3] = 0;
      local_40.ptr = (leaf_node<int,_false> *)malloc(0x18);
      (local_40.ptr)->type = LEAF_NODE;
      (local_40.ptr)->len = 0;
      (local_40.ptr)->child = (int *)0x0;
      (local_40.ptr)->guid = 0;
      (local_40.ptr)->_ref_count = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar9 + 2),&local_40);
      if ((local_40.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar2 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_40.ptr);
      }
      *(undefined8 **)this = puVar9;
      *(undefined4 *)(puVar9 + 4) = 1;
    }
    else {
      piVar10 = (int *)malloc(0x28);
      uVar2 = prVar3->cnt;
      uVar6 = prVar3->shift;
      uVar7 = prVar3->tail_len;
      uVar8 = *(undefined4 *)&prVar3->field_0xc;
      ptVar5 = (prVar3->root).ptr;
      *(leaf_node<int,_false> **)(piVar10 + 4) = (prVar3->tail).ptr;
      *(tree_node<int,_false> **)(piVar10 + 6) = ptVar5;
      piVar10[0] = uVar2;
      piVar10[1] = uVar6;
      piVar10[2] = uVar7;
      piVar10[3] = uVar8;
      uVar8 = *(undefined4 *)&prVar3->field_0x24;
      piVar10[8] = prVar3->_ref_count;
      piVar10[9] = uVar8;
      if (*(long *)(piVar10 + 6) != 0) {
        piVar1 = (int *)(*(long *)(piVar10 + 6) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (*(long *)(piVar10 + 4) != 0) {
        piVar1 = (int *)(*(long *)(piVar10 + 4) + 8);
        *piVar1 = *piVar1 + 1;
      }
      *(int **)this = piVar10;
      if (piVar10 == (int *)0x0) goto LAB_0013b1e7;
      piVar10[8] = 1;
      *piVar10 = *piVar10 + -1;
      if (prVar3->tail_len == 1) {
        rrb_details::promote_rightmost_leaf<int,false,5>
                  ((ref<immutable::rrb<int,_false,_5>_> *)this);
      }
      else {
        local_38 = (ref<immutable::rrb_details::leaf_node<int,_false>_> *)(piVar10 + 4);
        plVar4 = (prVar3->tail).ptr;
        uVar12 = plVar4->len - 1;
        __size = (ulong)uVar12 * 4 + 0x18;
        __s = (leaf_node<int,_false> *)malloc(__size);
        memset(__s,0,__size);
        __s->len = uVar12;
        __s->type = LEAF_NODE;
        __s->child = (int *)(__s + 1);
        __s->guid = 0;
        uVar2 = plVar4->len;
        if (uVar2 != 1) {
          piVar1 = plVar4->child;
          uVar11 = 0;
          do {
            (&__s[1].type)[uVar11] = piVar1[uVar11];
            uVar11 = uVar11 + 1;
          } while ((uVar2 - 1) + (uint)(uVar2 == 1) != uVar11);
        }
        __s->_ref_count = 1;
        piVar10[2] = piVar10[2] + -1;
        local_40.ptr = __s;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(local_38,&local_40);
        if ((local_40.ptr != (leaf_node<int,_false> *)0x0) &&
           (uVar2 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_40.ptr);
        }
      }
    }
    return (ref<immutable::rrb<int,_false,_5>_>)(rrb<int,_false,_5> *)this;
  }
LAB_0013b1e7:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<int, false>>::operator->() const [T = immutable::rrb<int, false>]"
               );
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }